

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<unsigned_long,unsigned_long,duckdb::GreaterThanEquals,false,false>
                (unsigned_long *ldata,unsigned_long *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  ulong uVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  idx_t iVar5;
  sel_t sVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (false_sel != (SelectionVector *)0x0 && true_sel != (SelectionVector *)0x0) {
    iVar5 = SelectFlatLoop<unsigned_long,unsigned_long,duckdb::GreaterThanEquals,false,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
    return iVar5;
  }
  uVar1 = count + 0x3f;
  if (true_sel == (SelectionVector *)0x0) {
    if (uVar1 < 0x40) {
      lVar9 = 0;
    }
    else {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      lVar9 = 0;
      uVar12 = 0;
      uVar13 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar7 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar7 = count;
          }
LAB_0149b1d1:
          uVar11 = uVar13;
          if (uVar13 < uVar7) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            do {
              uVar10 = uVar13;
              if (psVar3 != (sel_t *)0x0) {
                uVar10 = (ulong)psVar3[uVar13];
              }
              uVar11 = ldata[uVar13];
              uVar8 = rdata[uVar13];
              psVar4[lVar9] = (sel_t)uVar10;
              lVar9 = lVar9 + (ulong)(uVar11 < uVar8);
              uVar13 = uVar13 + 1;
              uVar11 = uVar7;
            } while (uVar7 != uVar13);
          }
        }
        else {
          uVar10 = puVar2[uVar12];
          uVar7 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar7 = count;
          }
          if (uVar10 == 0xffffffffffffffff) goto LAB_0149b1d1;
          uVar11 = uVar7;
          if (uVar10 == 0) {
            if (uVar13 < uVar7) {
              psVar3 = sel->sel_vector;
              psVar4 = false_sel->sel_vector;
              do {
                uVar10 = uVar13;
                if (psVar3 != (sel_t *)0x0) {
                  uVar10 = (ulong)psVar3[uVar13];
                }
                psVar4[lVar9] = (sel_t)uVar10;
                lVar9 = lVar9 + 1;
                uVar13 = uVar13 + 1;
              } while (uVar7 != uVar13);
            }
          }
          else {
            uVar11 = uVar13;
            if (uVar13 < uVar7) {
              psVar3 = sel->sel_vector;
              psVar4 = false_sel->sel_vector;
              uVar8 = 0;
              do {
                if (psVar3 == (sel_t *)0x0) {
                  sVar6 = (int)uVar13 + (int)uVar8;
                }
                else {
                  sVar6 = psVar3[uVar13 + uVar8];
                }
                if ((uVar10 >> (uVar8 & 0x3f) & 1) == 0) {
                  uVar11 = 1;
                }
                else {
                  uVar11 = (ulong)(ldata[uVar13 + uVar8] < rdata[uVar13 + uVar8]);
                }
                psVar4[lVar9] = sVar6;
                lVar9 = lVar9 + uVar11;
                uVar8 = uVar8 + 1;
                uVar11 = uVar7;
              } while ((uVar13 - uVar7) + uVar8 != 0);
            }
          }
        }
        uVar12 = uVar12 + 1;
        uVar13 = uVar11;
      } while (uVar12 != uVar1 >> 6);
    }
    iVar5 = count - lVar9;
  }
  else if (uVar1 < 0x40) {
    iVar5 = 0;
  }
  else {
    puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar5 = 0;
    uVar12 = 0;
    uVar13 = 0;
    do {
      if (puVar2 == (unsigned_long *)0x0) {
        uVar7 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar7 = count;
        }
LAB_0149b105:
        uVar11 = uVar13;
        if (uVar13 < uVar7) {
          psVar3 = sel->sel_vector;
          psVar4 = true_sel->sel_vector;
          do {
            uVar10 = uVar13;
            if (psVar3 != (sel_t *)0x0) {
              uVar10 = (ulong)psVar3[uVar13];
            }
            uVar11 = ldata[uVar13];
            uVar8 = rdata[uVar13];
            psVar4[iVar5] = (sel_t)uVar10;
            iVar5 = (iVar5 + 1) - (ulong)(uVar11 < uVar8);
            uVar13 = uVar13 + 1;
            uVar11 = uVar7;
          } while (uVar7 != uVar13);
        }
      }
      else {
        uVar10 = puVar2[uVar12];
        uVar7 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar7 = count;
        }
        uVar11 = uVar7;
        if (uVar10 != 0) {
          if (uVar10 == 0xffffffffffffffff) goto LAB_0149b105;
          uVar11 = uVar13;
          if (uVar13 < uVar7) {
            psVar3 = sel->sel_vector;
            psVar4 = true_sel->sel_vector;
            uVar8 = 0;
            do {
              if (psVar3 == (sel_t *)0x0) {
                sVar6 = (int)uVar13 + (int)uVar8;
              }
              else {
                sVar6 = psVar3[uVar13 + uVar8];
              }
              if ((uVar10 >> (uVar8 & 0x3f) & 1) == 0) {
                uVar11 = 0;
              }
              else {
                uVar11 = (ulong)(rdata[uVar13 + uVar8] <= ldata[uVar13 + uVar8]);
              }
              psVar4[iVar5] = sVar6;
              iVar5 = iVar5 + uVar11;
              uVar8 = uVar8 + 1;
              uVar11 = uVar7;
            } while ((uVar13 - uVar7) + uVar8 != 0);
          }
        }
      }
      uVar12 = uVar12 + 1;
      uVar13 = uVar11;
    } while (uVar12 != uVar1 >> 6);
  }
  return iVar5;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}